

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  Nf_Obj_t *pNVar1;
  Vec_Wec_t *p_00;
  Mio_Cell2_t *pMVar2;
  Nf_Obj_t *pNVar3;
  word wVar4;
  word wVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *p_01;
  ulong uVar10;
  word wVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  Nf_Mat_t (*paNVar15) [2];
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  word wVar20;
  long lVar21;
  bool bVar22;
  Nf_Obj_t *pBestF [6];
  
  pNVar1 = p->pNfObjs;
  uVar17 = *pCut;
  uVar6 = uVar17 & 0x1f;
  uVar16 = uVar17 >> 5;
  uVar7 = Abc_LitIsCompl(uVar16);
  p_00 = p->vTt2Match;
  iVar8 = Abc_Lit2Var(uVar16);
  p_01 = Vec_WecEntry(p_00,iVar8);
  for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    pBestF[uVar10] = p->pNfObjs + pCut[uVar10 + 1];
  }
  lVar14 = (long)iObj * 0x60;
  if (uVar6 == 0) {
    if (0x3f < uVar17) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x461,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
    }
    for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
      pNVar1 = p->pNfObjs;
      *(undefined8 *)((long)&pNVar1->M[0][1].D + lVar14) = 0;
      *(undefined8 *)((long)&pNVar1->M[0][0].D + lVar14) = 0;
      uVar7 = (uint)lVar21 ^ (uint)(uVar16 == 1);
      wVar11 = p->pCells[uVar7].Area;
      *(word *)((long)&pNVar1->M[0][1].A + lVar14) = wVar11;
      *(word *)((long)&pNVar1->M[0][0].A + lVar14) = wVar11;
      uVar17 = Nf_CutHandle(pCutSet,pCut);
      uVar6 = (uVar17 & 0x3ff) << 0x14;
      uVar17 = *(uint *)(&pNVar1->M[0][0].field_0x0 + lVar14);
      *(uint *)(&pNVar1->M[0][1].field_0x0 + lVar14) =
           *(uint *)(&pNVar1->M[0][1].field_0x0 + lVar14) & 0xc0000000 | uVar6 | uVar7;
      *(uint *)(&pNVar1->M[0][0].field_0x0 + lVar14) = uVar17 & 0xc0000000 | uVar6 | uVar7;
      *(undefined4 *)(&pNVar1->M[0][1].Cfg.field_0x0 + lVar14) = 0;
      *(undefined4 *)(&pNVar1->M[0][0].Cfg.field_0x0 + lVar14) = 0;
      lVar14 = lVar14 + 0x30;
    }
  }
  else {
    for (uVar17 = 0; (int)(uVar17 | 1) < p_01->nSize; uVar17 = uVar17 + 2) {
      iVar8 = Vec_IntEntry(p_01,uVar17);
      uVar16 = Vec_IntEntry(p_01,uVar17 | 1);
      pMVar2 = p->pCells;
      uVar13 = uVar16 & 1 ^ uVar7;
      wVar11 = Nf_ObjRequired(p,iObj,uVar13);
      if (uVar6 != *(uint *)&pMVar2[iVar8].field_0x10 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                      ,0x479,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
      }
      paNVar15 = pNVar1[iObj].M + uVar13;
      wVar20 = pMVar2[iVar8].Area;
      bVar12 = 0;
      uVar10 = 0;
      for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
        bVar22 = ((uVar16 >> 1 & 0x7f) >> ((uint)uVar18 & 0x1f) & 1) != 0;
        pNVar3 = pBestF[(uVar16 >> 8) >> (bVar12 & 0x1f) & 0xf];
        wVar4 = pMVar2[iVar8].Delays[uVar18];
        wVar5 = pNVar3->M[bVar22][0].D;
        if (wVar11 == 0xffffffffffffffff) {
LAB_005ab9fa:
          if (((*paNVar15)[0].D == 0xffffffffffffffff) ||
             (uVar19 = wVar4 + wVar5, (*paNVar15)[1].D == 0xffffffffffffffff)) {
            uVar19 = wVar4 + wVar5;
            lVar14 = 0;
          }
          else {
            lVar14 = 0;
            if (wVar11 < uVar19) goto LAB_005abae8;
          }
        }
        else {
          uVar19 = pNVar3->M[bVar22][1].D + wVar4;
          lVar14 = 1;
          if (wVar11 < uVar19) goto LAB_005ab9fa;
        }
        if (uVar10 <= uVar19) {
          uVar10 = uVar19;
        }
        wVar20 = wVar20 + pNVar3->M[bVar22][lVar14].A;
        bVar12 = bVar12 + 4;
      }
      if (uVar10 < (*paNVar15)[0].D) {
        (*paNVar15)[0].D = uVar10;
        (*paNVar15)[0].A = wVar20;
        uVar13 = Nf_CutHandle(pCutSet,pCut);
        uVar9 = (uVar13 & 0x3ff) << 0x14;
        uVar13 = *(uint *)*paNVar15;
        *(uint *)*paNVar15 = uVar13 & 0xc00fffff | uVar9;
        *(uint *)*paNVar15 =
             uVar13 & 0xc0000000 | uVar9 | *(uint *)&pMVar2[iVar8].field_0x10 & 0xfffff;
        (*paNVar15)[0].Cfg = (Nf_Cfg_t)(uVar16 & 0xfffffffe);
      }
      if (wVar20 < (*paNVar15)[1].A) {
        (*paNVar15)[1].D = uVar10;
        (*paNVar15)[1].A = wVar20;
        uVar13 = Nf_CutHandle(pCutSet,pCut);
        uVar9 = (uVar13 & 0x3ff) << 0x14;
        uVar13 = *(uint *)(*paNVar15 + 1);
        *(uint *)(*paNVar15 + 1) = uVar13 & 0xc00fffff | uVar9;
        *(uint *)(*paNVar15 + 1) =
             uVar13 & 0xc0000000 | uVar9 | *(uint *)&pMVar2[iVar8].field_0x10 & 0xfffff;
        (*paNVar15)[1].Cfg = (Nf_Cfg_t)(uVar16 & 0xfffffffe);
      }
LAB_005abae8:
    }
  }
  return;
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    word ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->A = pA->A = p->pCells[c ^ Const].Area;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        word Required  = Nf_ObjRequired( p, iObj, fCompl );
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        word Area      = pC->Area, Delay = 0;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->Delays[k] <= Required && Required != NF_INFINITY )
            {
                Delay = Abc_MaxWord( Delay, ArrivalA + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][1].A;
            }
            else 
            {
                if ( pD->D < NF_INFINITY && pA->D < NF_INFINITY && ArrivalD + pC->Delays[k] > Required )
                    break;
                Delay = Abc_MaxWord( Delay, ArrivalD + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][0].A;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->A = Area;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->A > Area )
        {
            pA->D = Delay;
            pA->A = Area;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}